

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

void Catch::Detail::registerListenerImpl(unique_ptr<Catch::EventListenerFactory> *listenerFactory)

{
  EventListenerFactory *pEVar1;
  Singleton<Catch::(anonymous_namespace)::RegistryHub,_Catch::IRegistryHub,_Catch::IMutableRegistryHub>
  *pSVar2;
  
  pSVar2 = Singleton<Catch::(anonymous_namespace)::RegistryHub,_Catch::IRegistryHub,_Catch::IMutableRegistryHub>
           ::getInternal();
  pEVar1 = listenerFactory->m_ptr;
  listenerFactory->m_ptr = (EventListenerFactory *)0x0;
  (*(pSVar2->super_RegistryHub).super_IMutableRegistryHub._vptr_IMutableRegistryHub[3])
            (&(pSVar2->super_RegistryHub).super_IMutableRegistryHub);
  if (pEVar1 != (EventListenerFactory *)0x0) {
    (*pEVar1->_vptr_EventListenerFactory[1])();
  }
  return;
}

Assistant:

void registerListenerImpl( Detail::unique_ptr<EventListenerFactory> listenerFactory ) {
            getMutableRegistryHub().registerListener( CATCH_MOVE(listenerFactory) );
        }